

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

MRIStepCoupling
MRIStepCoupling_Create(int nmat,int stages,int q,int p,sunrealtype *W,sunrealtype *G,sunrealtype *c)

{
  sunrealtype ***pppsVar1;
  sunrealtype **ppsVar2;
  sunrealtype *psVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  MRIStepCoupling pMVar7;
  ulong uVar8;
  MRISTEP_METHOD_TYPE type;
  ulong uVar9;
  sunrealtype *psVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (c == (sunrealtype *)0x0 || (stages < 1 || nmat < 1)) {
    return (MRIStepCoupling)0x0;
  }
  type = MRISTEP_EXPLICIT;
  bVar4 = G != (sunrealtype *)0x0 && W != (sunrealtype *)0x0;
  if (G != (sunrealtype *)0x0 && W != (sunrealtype *)0x0) {
    type = MRISTEP_IMEX;
    bVar5 = 0;
  }
  else {
    if (W == (sunrealtype *)0x0 || G != (sunrealtype *)0x0) {
      bVar5 = 0;
      if (G == (sunrealtype *)0x0 || W != (sunrealtype *)0x0) {
        return (MRIStepCoupling)0x0;
      }
      type = MRISTEP_IMPLICIT;
      bVar6 = 1;
      goto LAB_0013d79f;
    }
    bVar5 = 1;
  }
  bVar6 = 0;
LAB_0013d79f:
  pMVar7 = MRIStepCoupling_Alloc(nmat,stages,type);
  if (pMVar7 == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  pMVar7->q = q;
  pMVar7->p = p;
  uVar8 = (ulong)(uint)stages;
  psVar10 = pMVar7->c;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    psVar10[uVar9] = c[uVar9];
  }
  if ((bool)(bVar5 | bVar4)) {
    pppsVar1 = pMVar7->W;
    for (uVar9 = 0; uVar9 != (uint)nmat; uVar9 = uVar9 + 1) {
      ppsVar2 = pppsVar1[uVar9];
      psVar10 = W;
      for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        psVar3 = ppsVar2[uVar12];
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          psVar3[uVar11] = psVar10[uVar11];
        }
        psVar10 = psVar10 + uVar8;
      }
      W = W + uVar8 * uVar8;
    }
  }
  if ((bool)(bVar4 | bVar6)) {
    pppsVar1 = pMVar7->G;
    for (uVar9 = 0; uVar9 != (uint)nmat; uVar9 = uVar9 + 1) {
      ppsVar2 = pppsVar1[uVar9];
      psVar10 = G;
      for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        psVar3 = ppsVar2[uVar12];
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          psVar3[uVar11] = psVar10[uVar11];
        }
        psVar10 = psVar10 + uVar8;
      }
      G = G + uVar8 * uVar8;
    }
    return pMVar7;
  }
  return pMVar7;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Create(int nmat, int stages, int q, int p,
                                       sunrealtype* W, sunrealtype* G,
                                       sunrealtype* c)
{
  int i, j, k;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal inputs */
  if (nmat < 1 || stages < 1 || !c) { return (NULL); }

  /* Check for method coefficients and set method type */
  if (W && G) { type = MRISTEP_IMEX; }
  else if (W && !G) { type = MRISTEP_EXPLICIT; }
  else if (!W && G) { type = MRISTEP_IMPLICIT; }
  else { return (NULL); }

  /* Allocate MRIStepCoupling structure */
  MRIC = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRIC) { return (NULL); }

  /* -------------------------
   * Copy the inputs into MRIC
   * ------------------------- */

  /* Method and embedding order */
  MRIC->q = q;
  MRIC->p = p;

  /* Abscissae */
  for (i = 0; i < stages; i++) { MRIC->c[i] = c[i]; }

  /* Coupling coefficients stored as 1D arrays of length nmat * stages * stages,
     with each stages * stages matrix stored in C (row-major) order */
  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->W[k][i][j] = W[stages * (stages * k + i) + j];
        }
      }
    }
  }
  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->G[k][i][j] = G[stages * (stages * k + i) + j];
        }
      }
    }
  }

  return (MRIC);
}